

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_Proto2CustomJsonConflictError_Test::TestBody
          (ParserValidationErrorTest_Proto2CustomJsonConflictError_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,
            "3:18: The custom JSON name of field \"bar\" (\"baz\") conflicts with the custom JSON name of field \"foo\".\n"
           );
  text._M_str = 
  "syntax = \'proto2\';\nmessage TestMessage {\n  optional uint32 foo = 1 [json_name=\'baz\'];\n  optional uint32 bar = 2 [json_name=\'baz\'];\n}\n"
  ;
  text._M_len = 0x85;
  ParserTest::ExpectHasValidationErrors
            (&this->super_ParserValidationErrorTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto2CustomJsonConflictError) {
  ExpectHasValidationErrors(
      "syntax = 'proto2';\n"
      "message TestMessage {\n"
      "  optional uint32 foo = 1 [json_name='baz'];\n"
      "  optional uint32 bar = 2 [json_name='baz'];\n"
      "}\n",
      "3:18: The custom JSON name of field \"bar\" (\"baz\") conflicts "
      "with the custom JSON name of field \"foo\".\n");
}